

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::MinSampleShadingInstance::verifyImage
          (TestStatus *__return_storage_ptr__,MinSampleShadingInstance *this,
          ConstPixelBufferAccess *testShadingImage,ConstPixelBufferAccess *minShadingImage,
          ConstPixelBufferAccess *maxShadingImage)

{
  ostringstream *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  allocator<char> local_1a9;
  MessageBuilder local_1a8;
  
  dVar1 = getUniqueColorsCount(testShadingImage);
  dVar2 = getUniqueColorsCount(minShadingImage);
  dVar3 = getUniqueColorsCount(maxShadingImage);
  local_1a8.m_log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &local_1a8.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"\nColors found: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Min. colors expected: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  std::operator<<((ostream *)this_00,"Max. colors expected: ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00,"\n");
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  if (dVar1 < dVar2 || dVar3 < dVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Unique colors out of expected bounds",&local_1a9);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&local_1a8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"Unique colors within expected bounds",&local_1a9);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&local_1a8);
  }
  std::__cxx11::string::~string((string *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MinSampleShadingInstance::verifyImage (const tcu::ConstPixelBufferAccess& testShadingImage, const tcu::ConstPixelBufferAccess& minShadingImage, const tcu::ConstPixelBufferAccess& maxShadingImage)
{
	const deUint32	testColorCount	= getUniqueColorsCount(testShadingImage);
	const deUint32	minColorCount	= getUniqueColorsCount(minShadingImage);
	const deUint32	maxColorCount	= getUniqueColorsCount(maxShadingImage);

	tcu::TestLog& log = m_context.getTestContext().getLog();

	log << tcu::TestLog::Message
		<< "\nColors found: " << testColorCount << "\n"
		<< "Min. colors expected: " << minColorCount << "\n"
		<< "Max. colors expected: " << maxColorCount << "\n"
		<< tcu::TestLog::EndMessage;

	if (minColorCount > testColorCount || testColorCount > maxColorCount)
		return tcu::TestStatus::fail("Unique colors out of expected bounds");
	else
		return tcu::TestStatus::pass("Unique colors within expected bounds");
}